

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPTCPTransmitter::Poll(RTPTCPTransmitter *this)

{
  SocketType sock_00;
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  uint *puVar4;
  ulong local_68;
  size_t i;
  SocketType local_4c;
  undefined1 local_48 [4];
  SocketType sock;
  vector<int,_std::allocator<int>_> errSockets;
  iterator iStack_28;
  int status;
  iterator end;
  iterator it;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else {
    end = std::
          map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
          ::begin(&this->m_destSockets);
    iStack_28 = std::
                map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                ::end(&this->m_destSockets);
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
    while (bVar1 = std::operator!=(&end,&stack0xffffffffffffffd8), bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>
               ::operator->(&end);
      sock_00 = ppVar2->first;
      local_4c = sock_00;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>
               ::operator->(&end);
      errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = PollSocket(this,sock_00,&ppVar2->second);
      if (errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 0) {
        if (errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ == -1) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_48,&local_4c);
        errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>::
      operator++(&end);
    }
    for (local_68 = 0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_48), local_68 < sVar3;
        local_68 = local_68 + 1) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_48,local_68);
      (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x22])
                (this,(ulong)*puVar4);
    }
    this_local._4_4_ =
         errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::Poll()
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int status = 0;

	vector<SocketType> errSockets;

	while (it != end)
	{
		SocketType sock = it->first;
		status = PollSocket(sock, it->second);
		if (status < 0)
		{
			// Stop immediately on out of memory
			if (status == ERR_RTP_OUTOFMEM)
				break;
			else
			{
				errSockets.push_back(sock);
				// Don't let this count as an error (due to a closed connection for example),
				// otherwise the poll thread (if used) will stop because of this. Since there
				// may be more than one connection, that's not desirable in general.
				status = 0; 
			}
		}
		++it;
	}
	MAINMUTEX_UNLOCK

	for (size_t i = 0 ; i < errSockets.size() ; i++)
		OnReceiveError(errSockets[i]);

	return status;
}